

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.cpp
# Opt level: O2

void event_track::set_evte(vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in)

{
  pointer puVar1;
  pointer puVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t i_1;
  size_t i;
  pointer puVar6;
  ulong uVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_last;
  vector<unsigned_char,_std::allocator<unsigned_char>_> l_first;
  allocator_type local_189;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_168._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar6 = (pointer)0x0;
  do {
    puVar1 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish + (-0x10 - (long)puVar1) <= puVar6) {
LAB_00106f6c:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_188);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_168);
      return;
    }
    std::__cxx11::string::string((string *)&local_50,"urim",(allocator *)&local_148);
    bVar3 = compare_4cc((char *)(puVar6 + (long)puVar1),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar3) {
      puVar2 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = *(uint *)(puVar6 + (long)(puVar2 + -4));
      puVar1 = puVar6 + (long)(puVar2 + -4);
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\x10';
      puVar6[(long)puVar2] = 'e';
      puVar6[(long)((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + 1)] = 'v';
      puVar6[(long)((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + 2)] = 't';
      puVar6[(long)((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start + 3)] = 'e';
      __first._M_current =
           (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,__first,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(__first._M_current + (long)(puVar6 + 0xc)),&local_189);
      uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,&local_148);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_148);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_148,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar6 + (long)((moov_in->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_start + ((ulong)uVar4 - 4))
                   ),(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )(moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish,&local_189);
      iVar5 = uVar4 - 0x10;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_188,&local_148);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_148);
      if (iVar5 != 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (moov_in,(long)local_168._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_168._M_impl.super__Vector_impl_data._M_start);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                  (moov_in,(size_type)
                           ((moov_in->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish +
                            (long)local_188._M_impl.super__Vector_impl_data._M_finish +
                           (1 - (long)(local_188._M_impl.super__Vector_impl_data._M_start +
                                      (long)(moov_in->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            )._M_impl.super__Vector_impl_data._M_start))));
        for (uVar7 = 0;
            uVar7 < (ulong)((long)local_188._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_188._M_impl.super__Vector_impl_data._M_start);
            uVar7 = uVar7 + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (moov_in,local_188._M_impl.super__Vector_impl_data._M_start + uVar7);
        }
        uVar7 = 0;
        while( true ) {
          puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(moov_in->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar6) <= uVar7)
          break;
          std::__cxx11::string::string((string *)&local_130,"stsd",(allocator *)&local_148);
          bVar3 = compare_4cc((char *)(puVar6 + uVar7),&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            uVar4 = *(uint *)(puVar6 + (uVar7 - 4));
            uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) - iVar5;
            *(uint *)(puVar6 + (uVar7 - 4)) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000
            ;
          }
          std::__cxx11::string::string((string *)&local_70,"stbl",(allocator *)&local_148);
          bVar3 = compare_4cc((char *)(puVar6 + uVar7),&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            uVar4 = *(uint *)(puVar6 + (uVar7 - 4));
            uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) - iVar5;
            *(uint *)(puVar6 + (uVar7 - 4)) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000
            ;
          }
          std::__cxx11::string::string((string *)&local_90,"uri ",(allocator *)&local_148);
          bVar3 = compare_4cc((char *)(puVar6 + uVar7),&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            uVar4 = *(uint *)(puVar6 + (uVar7 - 4));
            uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) - iVar5;
            *(uint *)(puVar6 + (uVar7 - 4)) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000
            ;
          }
          std::__cxx11::string::string((string *)&local_b0,"minf",(allocator *)&local_148);
          bVar3 = compare_4cc((char *)(puVar6 + uVar7),&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            uVar4 = *(uint *)(puVar6 + (uVar7 - 4));
            uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) - iVar5;
            *(uint *)(puVar6 + (uVar7 - 4)) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000
            ;
          }
          std::__cxx11::string::string((string *)&local_d0,"mdia",(allocator *)&local_148);
          bVar3 = compare_4cc((char *)(puVar6 + uVar7),&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            uVar4 = *(uint *)(puVar6 + (uVar7 - 4));
            uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) - iVar5;
            *(uint *)(puVar6 + (uVar7 - 4)) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000
            ;
          }
          std::__cxx11::string::string((string *)&local_f0,"trak",(allocator *)&local_148);
          bVar3 = compare_4cc((char *)(puVar6 + uVar7),&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          if (bVar3) {
            uVar4 = *(uint *)(puVar6 + (uVar7 - 4));
            uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) - iVar5;
            *(uint *)(puVar6 + (uVar7 - 4)) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000
            ;
          }
          std::__cxx11::string::string((string *)&local_110,"moov",(allocator *)&local_148);
          bVar3 = compare_4cc((char *)(puVar6 + uVar7),&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          if (bVar3) {
            puVar6 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(uint *)(puVar6 + (uVar7 - 4));
            uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18
                    ) - iVar5;
            *(uint *)(puVar6 + (uVar7 - 4)) =
                 uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000
            ;
          }
          uVar7 = uVar7 + 1;
        }
      }
      goto LAB_00106f6c;
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void event_track::set_evte(std::vector<uint8_t>& moov_in)
{
	uint32_t size_diff = 0;

	std::vector<uint8_t> l_first;
	std::vector<uint8_t> l_last;

	// find the uri box containing the description of the urn, caerfull only use for the enclosed mdat box in the source code
	for (std::size_t k = 0; k < moov_in.size() - 16; k++)
	{
		if (compare_4cc((char *)&moov_in[k], std::string("urim")))
		{
			//cout << "urim box found" << endl;
			uint32_t or_size = fmp4_read_uint32((char *)&moov_in[k - 4]);
			fmp4_write_uint32(16, (char *)&moov_in[k - 4]);

			moov_in[k]     = 'e';
			moov_in[k + 1] = 'v';
			moov_in[k + 2] = 't';
			moov_in[k + 3] = 'e';

			size_diff = (uint32_t)(or_size - 16);

			// first part of the string
			l_first = std::vector<uint8_t>(moov_in.begin(), moov_in.begin() + k + 12);
			// last part of the string
			l_last = std::vector<uint8_t>(moov_in.begin() + k + or_size - 4, moov_in.end());

			size_t l_diff = moov_in.size() - l_first.size() - l_last.size() - size_diff;

			break;
		}
	}

	// new string representing the moov_box 
	if (size_diff != 0)
	{
		// cout << "scheme size difference is: " << size_diff << endl;

		moov_in.resize(l_first.size());
		moov_in.reserve(moov_in.size() + l_last.size() + 1);

		for (std::size_t i = 0; i < l_last.size(); i++)
			moov_in.push_back(l_last[i]);

		for (std::size_t i = 0; i < moov_in.size(); i++)
		{

			if (compare_4cc((char *)&moov_in[i], std::string("stsd")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("stbl")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("uri ")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}

			if (compare_4cc((char *)&moov_in[i], std::string("minf")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("mdia")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("trak")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
			if (compare_4cc((char *)&moov_in[i], std::string("moov")))
			{
				uint32_t or_size = fmp4_read_uint32((char *)&moov_in[i - 4]);
				or_size = (uint32_t)(or_size - size_diff);
				fmp4_write_uint32(or_size, (char *)&moov_in[i - 4]);
			}
		}
	}
}